

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
Kumu::operator<<(basic_ostream<char,_std::char_traits<char>_> *strm,LogEntry *Entry)

{
  string *psVar1;
  string local_1e0 [32];
  undefined1 local_1c0 [8];
  string buf;
  long local_190;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> s;
  LogEntry *Entry_local;
  basic_ostream<char,_std::char_traits<char>_> *strm_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::ios::copyfmt((ios *)((long)&local_190 + *(long *)(local_190 + -0x18)));
  std::ios_base::width((ios_base *)((long)&local_190 + *(long *)(local_190 + -0x18)),0);
  std::__cxx11::string::string((string *)local_1c0);
  psVar1 = LogEntry::CreateStringWithOptions(Entry,(string *)local_1c0,-0x100000);
  std::operator<<((ostream *)&local_190,(string *)psVar1);
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)strm,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return strm;
}

Assistant:

std::basic_ostream<char, std::char_traits<char> >&
Kumu::operator<<(std::basic_ostream<char, std::char_traits<char> >& strm, LogEntry const& Entry)
{
  std::basic_ostringstream<char, std::char_traits<char> > s;
  s.copyfmt(strm);
  s.width(0);
  std::string buf;

  s << Entry.CreateStringWithOptions(buf, LOG_OPTION_ALL);

  strm << s.str();
  return strm;
}